

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
WriteDense2Sparse<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,double[2]>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,double (*vec) [2])

{
  double (*in_RSI) [2];
  SparseVectorWriter<int,_double> *in_RDI;
  SparseVectorWriter<int,_double> gvw;
  ExampleNLFeeder *in_stack_ffffffffffffffc0;
  ExampleNLFeeder *this_00;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffffc8;
  ExampleNLFeeder local_28 [2];
  
  CountNNZ<double[2]>(in_stack_ffffffffffffffc0,(double (*) [2])in_RDI);
  this_00 = local_28;
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            (in_stack_ffffffffffffffc8,(size_t)this_00);
  WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,2ul>
            (this_00,in_RDI,in_RSI);
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
  SparseVectorWriter<int,_double>::~SparseVectorWriter((SparseVectorWriter<int,_double> *)local_28);
  return;
}

Assistant:

void WriteDense2Sparse(GradWriterFactory& gw, const DenseVec& vec) {
    auto gvw = gw.MakeVectorWriter(CountNNZ(vec));
    WriteDense2Sparse_Pure(gvw, vec);
  }